

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colamd.c
# Opt level: O0

size_t t_mult(size_t a,size_t k,int *ok)

{
  undefined8 local_30;
  size_t s;
  size_t i;
  int *ok_local;
  size_t k_local;
  size_t a_local;
  
  local_30 = 0;
  for (s = 0; s < k; s = s + 1) {
    local_30 = t_add(local_30,a,ok);
  }
  return local_30;
}

Assistant:

static size_t t_mult (size_t a, size_t k, int *ok)
{
    size_t i, s = 0 ;
    for (i = 0 ; i < k ; i++)
    {
	s = t_add (s, a, ok) ;
    }
    return (s) ;
}